

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.h
# Opt level: O1

string * jsonnet::internal::encode_utf8(string *__return_storage_ptr__,UString *s)

{
  size_type sVar1;
  pointer pcVar2;
  uint uVar3;
  char cVar4;
  long lVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = s->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (s->_M_dataplus)._M_p;
    lVar5 = 0;
    do {
      uVar3 = *(uint *)((long)pcVar2 + lVar5);
      if (0x10ffff < uVar3) {
        uVar3 = 0xfffd;
      }
      cVar4 = (char)__return_storage_ptr__;
      if (0x7f < uVar3) {
        if (uVar3 < 0x800) {
          std::__cxx11::string::push_back(cVar4);
        }
        else if (uVar3 < 0x10000) {
          std::__cxx11::string::push_back(cVar4);
          std::__cxx11::string::push_back(cVar4);
        }
        else {
          std::__cxx11::string::push_back(cVar4);
          std::__cxx11::string::push_back(cVar4);
          std::__cxx11::string::push_back(cVar4);
        }
      }
      std::__cxx11::string::push_back(cVar4);
      lVar5 = lVar5 + 4;
    } while (sVar1 << 2 != lVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline std::string encode_utf8(const UString &s)
{
    std::string r;
    encode_utf8(s, r);
    return r;
}